

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_dwo_name_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name;
  
  die_object::get_string_attribute_abi_cxx11_(&dwo_name,cu_die,0x2130);
  if (dwo_name.holds_value == true) {
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    optional(__return_storage_ptr__,&dwo_name);
  }
  else {
    die_object::get_string_attribute_abi_cxx11_(&dwo_name_1,cu_die,0x76);
    if (dwo_name_1.holds_value == true) {
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
      optional(__return_storage_ptr__,&dwo_name_1);
    }
    else {
      __return_storage_ptr__->holds_value = false;
    }
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    reset(&dwo_name_1);
  }
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
  reset(&dwo_name);
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_dwo_name(const die_object& cu_die) {
            if(auto dwo_name = cu_die.get_string_attribute(DW_AT_GNU_dwo_name)) {
                return dwo_name;
            } else if(auto dwo_name = cu_die.get_string_attribute(DW_AT_dwo_name)) {
                return dwo_name;
            } else {
                return nullopt;
            }
        }